

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

int spng__inflate_stream
              (spng_ctx *ctx,char **out,size_t *len,size_t extra,void *start_buf,size_t start_len)

{
  uLong uVar1;
  undefined1 auVar2 [16];
  z_stream *pzVar3;
  z_stream *pzVar4;
  ulong size_00;
  char *pcVar5;
  z_stream *stream;
  void *buf;
  void *t;
  size_t size;
  size_t sStack_50;
  uint32_t read_size;
  size_t max;
  int ret;
  size_t start_len_local;
  void *start_buf_local;
  size_t extra_local;
  size_t *len_local;
  char **out_local;
  spng_ctx *ctx_local;
  
  ctx_local._4_4_ = spng__inflate_init(ctx,0xf);
  if (ctx_local._4_4_ == 0) {
    sStack_50 = ctx->chunk_cache_limit - ctx->chunk_cache_usage;
    if (ctx->max_chunk_size < sStack_50) {
      sStack_50 = ctx->max_chunk_size;
    }
    if (sStack_50 < extra) {
      ctx_local._4_4_ = 0x4d;
    }
    else {
      t = (void *)0x2000;
      stream = (z_stream *)spng__malloc(ctx,0x2000);
      if (stream == (z_stream *)0x0) {
        ctx_local._4_4_ = 2;
      }
      else {
        pzVar3 = &ctx->zstream;
        if ((start_buf == (void *)0x0) || (start_len == 0)) {
          (ctx->zstream).avail_in = 0;
          pzVar3->next_in = (Bytef *)0x0;
        }
        else {
          (ctx->zstream).avail_in = (uInt)start_len;
          pzVar3->next_in = (Bytef *)start_buf;
        }
        (ctx->zstream).avail_out = 0x2000;
        (ctx->zstream).next_out = (Bytef *)stream;
        max._4_4_ = 0;
        while ((max._4_4_ != 1 && (max._4_4_ = inflate(pzVar3,0), max._4_4_ != 1))) {
          if ((max._4_4_ != 0) && (max._4_4_ != -5)) {
            max._4_4_ = 0x40;
            goto LAB_00112b95;
          }
          if ((ctx->zstream).avail_out == 0) {
            auVar2._8_8_ = 0;
            auVar2._0_8_ = t;
            if ((SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar2,0) < 2) ||
               ((void *)(sStack_50 - extra >> 1) < t)) {
              max._4_4_ = 0x4d;
              goto LAB_00112b95;
            }
            pzVar4 = (z_stream *)spng__realloc(ctx,stream,(size_t)((long)t << 1));
            if (pzVar4 == (z_stream *)0x0) goto LAB_00112b8e;
            (ctx->zstream).avail_out = (uint)t & 0x7fffffff;
            (ctx->zstream).next_out =
                 (Bytef *)((long)&pzVar4->next_in + ((ulong)t & 0x7fffffffffffffff));
            stream = pzVar4;
            t = (void *)((long)t << 1);
          }
          else if ((ctx->zstream).avail_in == 0) {
            size._4_4_ = ctx->cur_chunk_bytes_left;
            if (((*(ushort *)&ctx->field_0xcc & 1) != 0) && (0x2000 < size._4_4_)) {
              size._4_4_ = 0x2000;
            }
            max._4_4_ = read_chunk_bytes(ctx,size._4_4_);
            if (max._4_4_ != 0) {
              if (size._4_4_ == 0) {
                max._4_4_ = 0x40;
              }
              goto LAB_00112b95;
            }
            (ctx->zstream).avail_in = size._4_4_;
            pzVar3->next_in = ctx->data;
            max._4_4_ = 0;
          }
        }
        uVar1 = (ctx->zstream).total_out;
        if (uVar1 == 0) {
          max._4_4_ = 0x40;
        }
        else {
          size_00 = extra + uVar1;
          if ((extra <= size_00) &&
             (pcVar5 = (char *)spng__realloc(ctx,stream,size_00), pcVar5 != (char *)0x0)) {
            increase_cache_usage(ctx,size_00,0);
            *out = pcVar5;
            *len = size_00;
            return 0;
          }
LAB_00112b8e:
          max._4_4_ = 2;
        }
LAB_00112b95:
        spng__free(ctx,stream);
        ctx_local._4_4_ = max._4_4_;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static int spng__inflate_stream(spng_ctx *ctx, char **out, size_t *len, size_t extra, const void *start_buf, size_t start_len)
{
    int ret = spng__inflate_init(ctx, 15);
    if(ret) return ret;

    size_t max = ctx->chunk_cache_limit - ctx->chunk_cache_usage;

    if(ctx->max_chunk_size < max) max = ctx->max_chunk_size;

    if(extra > max) return SPNG_ECHUNK_LIMITS;
    max -= extra;

    uint32_t read_size;
    size_t size = 8 * 1024;
    void *t, *buf = spng__malloc(ctx, size);

    if(buf == NULL) return SPNG_EMEM;

    z_stream *stream = &ctx->zstream;

    if(start_buf != NULL && start_len)
    {
        stream->avail_in = (uInt)start_len;
        stream->next_in = start_buf;
    }
    else
    {
        stream->avail_in = 0;
        stream->next_in = NULL;
    }

    stream->avail_out = (uInt)size;
    stream->next_out = buf;

    while(ret != Z_STREAM_END)
    {
        ret = inflate(stream, Z_NO_FLUSH);

        if(ret == Z_STREAM_END) break;

        if(ret != Z_OK && ret != Z_BUF_ERROR)
        {
            ret = SPNG_EZLIB;
            goto err;
        }

        if(!stream->avail_out) /* Resize buffer */
        {
            /* overflow or reached chunk/cache limit */
            if( (2 > SIZE_MAX / size) || (size > max / 2) )
            {
                ret = SPNG_ECHUNK_LIMITS;
                goto err;
            }

            size *= 2;

            t = spng__realloc(ctx, buf, size);
            if(t == NULL) goto mem;

            buf = t;

            stream->avail_out = (uInt)size / 2;
            stream->next_out = (unsigned char*)buf + size / 2;
        }
        else if(!stream->avail_in) /* Read more chunk bytes */
        {
            read_size = ctx->cur_chunk_bytes_left;
            if(ctx->streaming && read_size > SPNG_READ_SIZE) read_size = SPNG_READ_SIZE;

            ret = read_chunk_bytes(ctx, read_size);

            if(ret)
            {
                if(!read_size) ret = SPNG_EZLIB;

                goto err;
            }

            stream->avail_in = read_size;
            stream->next_in = ctx->data;
        }
    }

    size = stream->total_out;

    if(!size)
    {
        ret = SPNG_EZLIB;
        goto err;
    }

    size += extra;
    if(size < extra) goto mem;

    t = spng__realloc(ctx, buf, size);
    if(t == NULL) goto mem;

    buf = t;

    (void)increase_cache_usage(ctx, size, 0);

    *out = buf;
    *len = size;

    return 0;

mem:
    ret = SPNG_EMEM;
err:
    spng__free(ctx, buf);
    return ret;
}